

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O1

int cmsysProcess_AddCommand(cmsysProcess *cp,char **command)

{
  long *plVar1;
  uint uVar2;
  char ***pppcVar3;
  long lVar4;
  char ***__ptr;
  char **ppcVar5;
  char *pcVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  size_t __size;
  long lVar10;
  
  iVar8 = 0;
  if ((command != (char **)0x0 && cp != (cmsysProcess *)0x0) &&
     (pcVar6 = *command, pcVar6 != (char *)0x0)) {
    uVar2 = cp->NumberOfCommands;
    lVar4 = (long)(int)uVar2;
    __ptr = (char ***)malloc(lVar4 * 8 + 8);
    iVar8 = 0;
    if (__ptr != (char ***)0x0) {
      if (0 < (int)uVar2) {
        pppcVar3 = cp->Commands;
        uVar7 = 0;
        do {
          __ptr[uVar7] = pppcVar3[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar2 != uVar7);
      }
      if (cp->Verbatim == 0) {
        __size = 0;
        do {
          plVar1 = (long *)((long)command + __size);
          __size = __size + 8;
        } while (*plVar1 != 0);
        ppcVar5 = (char **)malloc(__size);
        __ptr[lVar4] = ppcVar5;
        if (ppcVar5 == (char **)0x0) {
LAB_00133a28:
          free(__ptr);
          return 0;
        }
        lVar10 = (long)__size >> 3;
        if (1 < lVar10) {
          lVar9 = 1;
          do {
            if (command[lVar9 + -1] == (char *)0x0) {
              __assert_fail("command[i]",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/kwsys/ProcessUNIX.c"
                            ,0x1cd,
                            "int cmsysProcess_AddCommand(cmsysProcess *, const char *const *)");
            }
            pcVar6 = strdup(command[lVar9 + -1]);
            __ptr[lVar4][lVar9 + -1] = pcVar6;
            if (__ptr[lVar4][lVar9 + -1] == (char *)0x0) {
              if (lVar9 != 1) {
                do {
                  free(__ptr[cp->NumberOfCommands][lVar9 + -2]);
                  lVar9 = lVar9 + -1;
                } while (1 < lVar9);
              }
              goto LAB_00133a28;
            }
            lVar9 = lVar9 + 1;
          } while (lVar10 != lVar9);
        }
        __ptr[lVar4][lVar10 + -1] = (char *)0x0;
      }
      else {
        ppcVar5 = cmsysSystem_Parse_CommandForUnix(pcVar6,0);
        __ptr[cp->NumberOfCommands] = ppcVar5;
        if ((ppcVar5 == (char **)0x0) || (*ppcVar5 == (char *)0x0)) {
          free(__ptr);
          return 0;
        }
      }
      free(cp->Commands);
      cp->Commands = __ptr;
      cp->NumberOfCommands = uVar2 + 1;
      iVar8 = 1;
    }
  }
  return iVar8;
}

Assistant:

int kwsysProcess_AddCommand(kwsysProcess* cp, char const* const* command)
{
  int newNumberOfCommands;
  char*** newCommands;

  /* Make sure we have a command to add.  */
  if(!cp || !command || !*command)
    {
    return 0;
    }

  /* Allocate a new array for command pointers.  */
  newNumberOfCommands = cp->NumberOfCommands + 1;
  if(!(newCommands =
       (char***)malloc(sizeof(char**) *(size_t)(newNumberOfCommands))))
    {
    /* Out of memory.  */
    return 0;
    }

  /* Copy any existing commands into the new array.  */
  {
  int i;
  for(i=0; i < cp->NumberOfCommands; ++i)
    {
    newCommands[i] = cp->Commands[i];
    }
  }

  /* Add the new command.  */
  if(cp->Verbatim)
    {
    /* In order to run the given command line verbatim we need to
       parse it.  */
    newCommands[cp->NumberOfCommands] =
      kwsysSystem_Parse_CommandForUnix(*command, 0);
    if(!newCommands[cp->NumberOfCommands] ||
       !newCommands[cp->NumberOfCommands][0])
      {
      /* Out of memory or no command parsed.  */
      free(newCommands);
      return 0;
      }
    }
  else
    {
    /* Copy each argument string individually.  */
    char const* const* c = command;
    kwsysProcess_ptrdiff_t n = 0;
    kwsysProcess_ptrdiff_t i = 0;
    while(*c++);
    n = c - command - 1;
    newCommands[cp->NumberOfCommands] =
      (char**)malloc((size_t)(n+1)*sizeof(char*));
    if(!newCommands[cp->NumberOfCommands])
      {
      /* Out of memory.  */
      free(newCommands);
      return 0;
      }
    for(i=0; i < n; ++i)
      {
      assert(command[i]); /* Quiet Clang scan-build. */
      newCommands[cp->NumberOfCommands][i] = strdup(command[i]);
      if(!newCommands[cp->NumberOfCommands][i])
        {
        break;
        }
      }
    if(i < n)
      {
      /* Out of memory.  */
      for(;i > 0; --i)
        {
        free(newCommands[cp->NumberOfCommands][i-1]);
        }
      free(newCommands);
      return 0;
      }
    newCommands[cp->NumberOfCommands][n] = 0;
    }

  /* Successfully allocated new command array.  Free the old array. */
  free(cp->Commands);
  cp->Commands = newCommands;
  cp->NumberOfCommands = newNumberOfCommands;

  return 1;
}